

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Duration.cpp
# Opt level: O0

bool __thiscall Duration::parse_designated(Duration *this,Pig *pig)

{
  bool bVar1;
  uint c;
  size_type sVar2;
  time_t tStack_30;
  int following;
  longlong value;
  size_type checkpoint;
  Pig *pig_local;
  Duration *this_local;
  
  checkpoint = (size_type)pig;
  pig_local = (Pig *)this;
  value = Pig::cursor(pig);
  bVar1 = Pig::skip((Pig *)checkpoint,0x50);
  if ((bVar1) && (bVar1 = Pig::eos((Pig *)checkpoint), !bVar1)) {
    Pig::save((Pig *)checkpoint);
    bVar1 = Pig::getDigits((Pig *)checkpoint,&stack0xffffffffffffffd0);
    if ((bVar1) && (bVar1 = Pig::skip((Pig *)checkpoint,0x59), bVar1)) {
      this->_year = (int)tStack_30;
    }
    else {
      Pig::restore((Pig *)checkpoint);
    }
    Pig::save((Pig *)checkpoint);
    bVar1 = Pig::getDigits((Pig *)checkpoint,&stack0xffffffffffffffd0);
    if ((bVar1) && (bVar1 = Pig::skip((Pig *)checkpoint,0x4d), bVar1)) {
      this->_month = (int)tStack_30;
    }
    else {
      Pig::restore((Pig *)checkpoint);
    }
    Pig::save((Pig *)checkpoint);
    bVar1 = Pig::getDigits((Pig *)checkpoint,&stack0xffffffffffffffd0);
    if ((bVar1) && (bVar1 = Pig::skip((Pig *)checkpoint,0x44), bVar1)) {
      this->_day = (int)tStack_30;
    }
    else {
      Pig::restore((Pig *)checkpoint);
    }
    bVar1 = Pig::skip((Pig *)checkpoint,0x54);
    if ((bVar1) && (bVar1 = Pig::eos((Pig *)checkpoint), !bVar1)) {
      Pig::save((Pig *)checkpoint);
      bVar1 = Pig::getDigits((Pig *)checkpoint,&stack0xffffffffffffffd0);
      if ((bVar1) && (bVar1 = Pig::skip((Pig *)checkpoint,0x48), bVar1)) {
        this->_hours = (int)tStack_30;
      }
      else {
        Pig::restore((Pig *)checkpoint);
      }
      Pig::save((Pig *)checkpoint);
      bVar1 = Pig::getDigits((Pig *)checkpoint,&stack0xffffffffffffffd0);
      if ((bVar1) && (bVar1 = Pig::skip((Pig *)checkpoint,0x4d), bVar1)) {
        this->_minutes = (int)tStack_30;
      }
      else {
        Pig::restore((Pig *)checkpoint);
      }
      Pig::save((Pig *)checkpoint);
      bVar1 = Pig::getDigits((Pig *)checkpoint,&stack0xffffffffffffffd0);
      if ((bVar1) && (bVar1 = Pig::skip((Pig *)checkpoint,0x53), bVar1)) {
        this->_seconds = tStack_30;
      }
      else {
        Pig::restore((Pig *)checkpoint);
      }
    }
    c = Pig::peek((Pig *)checkpoint);
    sVar2 = Pig::cursor((Pig *)checkpoint);
    if (((2 < sVar2 - value) && (bVar1 = unicodeLatinAlpha(c), !bVar1)) &&
       (bVar1 = unicodeLatinDigit(c), !bVar1)) {
      return true;
    }
  }
  Pig::restoreTo((Pig *)checkpoint,value);
  return false;
}

Assistant:

bool Duration::parse_designated (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (pig.skip ('P') &&
      ! pig.eos ())
  {
    long long value;
    pig.save ();
    if (pig.getDigits (value) && pig.skip ('Y'))
      _year = value;
    else
      pig.restore ();

    pig.save ();
    if (pig.getDigits (value) && pig.skip ('M'))
      _month = value;
    else
      pig.restore ();

    pig.save ();
    if (pig.getDigits (value) && pig.skip ('D'))
      _day = value;
    else
      pig.restore ();

    if (pig.skip ('T') &&
        ! pig.eos ())
    {
      pig.save ();
      if (pig.getDigits (value) && pig.skip ('H'))
        _hours = value;
      else
        pig.restore ();

      pig.save ();
      if (pig.getDigits (value) && pig.skip ('M'))
        _minutes = value;
      else
        pig.restore ();

      pig.save ();
      if (pig.getDigits (value) && pig.skip ('S'))
        _seconds = value;
      else
        pig.restore ();
    }

    auto following = pig.peek ();
    if (pig.cursor () - checkpoint >= 3   &&
        ! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
      return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}